

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O0

void __thiscall
writer_test_should_write_int_field_Test::TestBody(writer_test_should_write_int_field_Test *this)

{
  bool bVar1;
  char *message;
  Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_> *field_00;
  AssertHelper local_1f0;
  Message local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  ostringstream local_1a0 [8];
  ostringstream oss;
  int local_24;
  undefined1 local_20 [8];
  Field field;
  writer_test_should_write_int_field_Test *this_local;
  
  field._8_8_ = this;
  Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>::Field
            ((Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_> *)local_20);
  local_24 = 0x19;
  Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>::set<int>
            ((Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_> *)local_20,&local_24);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  Fixpp::writeField<Fixpp::Field<Fixpp::TagT<34u,Fixpp::Type::Int>>>
            ((Fixpp *)local_1a0,(ostream *)local_20,field_00);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[7]>
            ((EqHelper<false> *)local_1c0,"oss.str()","\"34=25|\"",&local_1e0,(char (*) [7])"34=25|"
            );
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0xc5,message);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

TEST(writer_test, should_write_int_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::MsgSeqNum>;
    Field field;
    field.set(25);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "34=25|");
}